

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::B3DImporter::ReadBRUS(B3DImporter *this)

{
  pointer pbVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  aiMaterial *this_00;
  B3DImporter *pBVar6;
  size_t sVar7;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat;
  float specpow;
  float alpha;
  aiColor3D speccolor;
  string name;
  int i;
  aiString ainame;
  _Head_base<0UL,_aiMaterial_*,_false> local_8f8;
  float local_8ec;
  float local_8e8;
  float local_8e4;
  float local_8e0;
  float local_8dc;
  float local_8d8;
  string local_8c0;
  vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
  *local_8a0;
  undefined8 local_898;
  float local_890;
  undefined1 local_888 [32];
  float local_868;
  undefined1 local_858 [32];
  aiString local_838;
  aiString local_434;
  
  uVar3 = ReadInt(this);
  if (8 < uVar3) {
    local_858._0_8_ = local_858 + 0x10;
    pBVar6 = (B3DImporter *)local_858;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"Bad texture count","");
    Fail(pBVar6,(string *)local_858);
  }
  if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] != this->_pos) {
    local_8a0 = (vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
                 *)&this->_materials;
    do {
      ReadString_abi_cxx11_(&local_8c0,this);
      local_8d8 = ReadFloat(this);
      local_868 = ReadFloat(this);
      local_890 = ReadFloat(this);
      local_898 = CONCAT44(local_868,local_8d8);
      local_8e8 = ReadFloat(this);
      local_8d8 = ReadFloat(this);
      ReadInt(this);
      uVar4 = ReadInt(this);
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      sVar7 = local_8c0._M_string_length & 0xffffffff;
      if ((local_8c0._M_string_length & 0xfffffc00) != 0) {
        sVar7 = 0x3ff;
      }
      local_434.length = (ai_uint32)sVar7;
      local_8f8._M_head_impl = this_00;
      memcpy(local_434.data,local_8c0._M_dataplus._M_p,sVar7);
      local_434.data[sVar7] = '\0';
      aiMaterial::AddProperty(this_00,&local_434,"?mat.name",0,0);
      aiMaterial::AddBinaryProperty
                (local_8f8._M_head_impl,&local_898,0xc,"$clr.diffuse",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty
                (local_8f8._M_head_impl,&local_8e8,4,"$mat.opacity",0,0,aiPTI_Float);
      local_8e4 = local_8d8;
      local_8e0 = local_8d8;
      local_8dc = local_8d8;
      aiMaterial::AddBinaryProperty
                (local_8f8._M_head_impl,&local_8e4,0xc,"$clr.specular",0,0,aiPTI_Float);
      local_8ec = local_8d8 * 128.0;
      aiMaterial::AddBinaryProperty
                (local_8f8._M_head_impl,&local_8ec,4,"$mat.shininess",0,0,aiPTI_Float);
      if ((uVar4 & 0x10) != 0) {
        local_838.length = 1;
        aiMaterial::AddBinaryProperty
                  (local_8f8._M_head_impl,&local_838,4,"$mat.twosided",0,0,aiPTI_Integer);
      }
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          uVar5 = ReadInt(this);
          if (((int)uVar5 < -1) ||
             ((-1 < (int)uVar5 &&
              ((int)((ulong)((long)(this->_textures).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->_textures).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5) <= (int)uVar5))))
          {
            local_888._0_8_ = local_888 + 0x10;
            pBVar6 = (B3DImporter *)local_888;
            std::__cxx11::string::_M_construct<char_const*>((string *)pBVar6,"Bad texture id","");
            Fail(pBVar6,(string *)local_888);
          }
          if (uVar4 == 0 && -1 < (int)uVar5) {
            pbVar1 = (this->_textures).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar2 = pbVar1[uVar5]._M_string_length;
            sVar7 = uVar2 & 0xffffffff;
            if ((uVar2 & 0xfffffc00) != 0) {
              sVar7 = 0x3ff;
            }
            local_838.length = (ai_uint32)sVar7;
            memcpy(local_838.data,pbVar1[uVar5]._M_dataplus._M_p,sVar7);
            local_838.data[sVar7] = '\0';
            aiMaterial::AddProperty(local_8f8._M_head_impl,&local_838,"$tex.file",1,0);
          }
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      std::
      vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
      ::emplace_back<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>
                (local_8a0,(unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&local_8f8);
      std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
                ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&local_8f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
        operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
      }
    } while ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] != this->_pos);
  }
  return;
}

Assistant:

void B3DImporter::ReadBRUS(){
    int n_texs=ReadInt();
    if( n_texs<0 || n_texs>8 ){
        Fail( "Bad texture count" );
    }
    while( ChunkSize() ){
        string name=ReadString();
        aiVector3D color=ReadVec3();
        float alpha=ReadFloat();
        float shiny=ReadFloat();
        /*int blend=**/ReadInt();
        int fx=ReadInt();

        std::unique_ptr<aiMaterial> mat(new aiMaterial);

        // Name
        aiString ainame( name );
        mat->AddProperty( &ainame,AI_MATKEY_NAME );

        // Diffuse color
        mat->AddProperty( &color,1,AI_MATKEY_COLOR_DIFFUSE );

        // Opacity
        mat->AddProperty( &alpha,1,AI_MATKEY_OPACITY );

        // Specular color
        aiColor3D speccolor( shiny,shiny,shiny );
        mat->AddProperty( &speccolor,1,AI_MATKEY_COLOR_SPECULAR );

        // Specular power
        float specpow=shiny*128;
        mat->AddProperty( &specpow,1,AI_MATKEY_SHININESS );

        // Double sided
        if( fx & 0x10 ){
            int i=1;
            mat->AddProperty( &i,1,AI_MATKEY_TWOSIDED );
        }

        //Textures
        for( int i=0;i<n_texs;++i ){
            int texid=ReadInt();
            if( texid<-1 || (texid>=0 && texid>=static_cast<int>(_textures.size())) ){
                Fail( "Bad texture id" );
            }
            if( i==0 && texid>=0 ){
                aiString texname( _textures[texid] );
                mat->AddProperty( &texname,AI_MATKEY_TEXTURE_DIFFUSE(0) );
            }
        }
        _materials.emplace_back( std::move(mat) );
    }
}